

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseRAPass::blockEntryAssigned(BaseRAPass *this,PhysToWorkMap *physToWorkMap)

{
  byte bVar1;
  uint32_t uVar2;
  RAStrategy *pRVar3;
  byte *pbVar4;
  uint *puVar5;
  RAWorkReg **ppRVar6;
  RegGroup RVar7;
  RegGroup group;
  BitWordIterator<unsigned_int> it;
  
  for (RVar7 = k0; RVar7 != kPC; RVar7 = RVar7 + kVec) {
    group = RVar7;
    pRVar3 = Support::Array<asmjit::v1_14::RAStrategy,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&this->_strategy,&group);
    if (pRVar3->_type != kSimple) {
      pbVar4 = RARegCount::operator[](&(this->_physRegIndex).super_RARegCount,group);
      bVar1 = *pbVar4;
      puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                         ((Array<unsigned_int,_4UL> *)physToWorkMap,&group);
      _it = *puVar5;
      while (_it != 0) {
        uVar2 = Support::BitWordIterator<unsigned_int>::next(&it);
        ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                            (&this->_workRegs,(ulong)physToWorkMap->workIds[uVar2 + bVar1]);
        *(uint *)(*ppRVar6 + 0x3c) = *(uint *)(*ppRVar6 + 0x3c) | 1 << ((byte)uVar2 & 0x1f);
      }
    }
  }
  return 0;
}

Assistant:

Error BaseRAPass::blockEntryAssigned(const PhysToWorkMap* physToWorkMap) noexcept {
  // Complex allocation strategy requires to record register assignments upon block entry (or per shared state).
  for (RegGroup group : RegGroupVirtValues{}) {
    if (!_strategy[group].isComplex())
      continue;

    uint32_t physBaseIndex = _physRegIndex[group];
    Support::BitWordIterator<RegMask> it(physToWorkMap->assigned[group]);

    while (it.hasNext()) {
      uint32_t physId = it.next();
      uint32_t workId = physToWorkMap->workIds[physBaseIndex + physId];

      RAWorkReg* workReg = workRegById(workId);
      workReg->addAllocatedMask(Support::bitMask(physId));
    }
  }

  return kErrorOk;
}